

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayGetterCalls::verifyGetTexParameter
          (TextureCubeMapArrayGetterCalls *this,GLenum pname,GLint expected_value)

{
  ostringstream *poVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  TestError *this_00;
  GLint int_value;
  undefined1 local_1a0 [384];
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xad0))(0x9009,pname);
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (iVar2 == 0) {
    if (expected_value != 0) {
      local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"glGetTexParameteriv() called for pname: [");
      pcVar3 = getStringForGetTexParameterPname(pname);
      std::operator<<((ostream *)poVar1,pcVar3);
      std::operator<<((ostream *)poVar1,"] returned an invalid value of:[");
      std::ostream::operator<<(poVar1,0);
      std::operator<<((ostream *)poVar1,"], expected:[");
      std::ostream::operator<<(poVar1,expected_value);
      std::operator<<((ostream *)poVar1,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      this->m_test_passed = '\0';
    }
    return;
  }
  local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"glGetTexParameteriv() call failed for pname: ");
  pcVar3 = getStringForGetTexParameterPname(pname);
  std::operator<<((ostream *)poVar1,pcVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"glGetTexLevelParameteriv() call failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGetterCalls.cpp"
             ,0x1e4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayGetterCalls::verifyGetTexParameter(glw::GLenum pname, glw::GLint expected_value)
{
	/* Retrieve ES function pointers */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint int_value = 0;

	/* Retrieve property value(s) using glGetTexParameteriv() */
	gl.getTexParameteriv(GL_TEXTURE_CUBE_MAP_ARRAY, pname, &int_value);

	if (gl.getError() != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetTexParameteriv() call failed for pname: " << getStringForGetTexParameterPname(pname)
						   << tcu::TestLog::EndMessage;

		TCU_FAIL("glGetTexLevelParameteriv() call failed");
	}

	if (int_value != expected_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetTexParameteriv() called for pname: "
													   "["
						   << getStringForGetTexParameterPname(pname) << "]"
																		 " returned an invalid value of:"
																		 "["
						   << int_value << "]"
										   ", expected:"
										   "["
						   << expected_value << "]" << tcu::TestLog::EndMessage;

		m_test_passed = false;
	}
}